

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void * fio_defer_cycle(void *ignr)

{
  int16_t iVar1;
  void *ignr_local;
  
  fio_defer_on_thread_start();
  while( true ) {
    fio_defer_perform();
    iVar1 = fio_is_running();
    if (iVar1 == 0) break;
    fio_defer_thread_wait();
  }
  fio_defer_on_thread_end();
  return ignr;
}

Assistant:

static void *fio_defer_cycle(void *ignr) {
  fio_defer_on_thread_start();
  for (;;) {
    fio_defer_perform();
    if (!fio_is_running())
      break;
    fio_defer_thread_wait();
  }
  fio_defer_on_thread_end();
  return ignr;
}